

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hpdf_xref.c
# Opt level: O2

HPDF_STATUS HPDF_Xref_Add(HPDF_Xref xref,void *obj)

{
  undefined1 *item;
  HPDF_STATUS HVar1;
  
  if (obj == (void *)0x0) {
    HVar1 = HPDF_Error_GetCode(xref->error);
    if (HVar1 != 0) {
      return 0x1033;
    }
  }
  else if (*obj < 0x40000000) {
    if (xref->entries->count < 0x7fffff) {
      item = (undefined1 *)HPDF_GetMem(xref->mmgr,0x18);
      if (item != (undefined1 *)0x0) {
        HVar1 = HPDF_List_Add(xref->entries,item);
        if (HVar1 == 0) {
          *item = 0x6e;
          *(undefined4 *)(item + 4) = 0;
          *(undefined2 *)(item + 8) = 0;
          *(void **)(item + 0x10) = obj;
          *(HPDF_UINT32 *)obj = xref->start_offset + xref->entries->count + 0x3fffffff;
          *(undefined2 *)((long)obj + 4) = 0;
          return 0;
        }
        HPDF_FreeMem(xref->mmgr,item);
      }
    }
    else {
      HPDF_SetError(xref->error,0x1065,0);
    }
    HPDF_Obj_ForceFree(xref->mmgr,obj);
    HVar1 = HPDF_Error_GetCode(xref->error);
    return HVar1;
  }
  HVar1 = HPDF_SetError(xref->error,0x1033,0);
  return HVar1;
}

Assistant:

HPDF_STATUS
HPDF_Xref_Add  (HPDF_Xref  xref,
                void       *obj)
{
    HPDF_XrefEntry entry;
    HPDF_Obj_Header *header;

    HPDF_PTRACE((" HPDF_Xref_Add\n"));

    if (!obj) {
        if (HPDF_Error_GetCode (xref->error) == HPDF_OK)
            return HPDF_SetError (xref->error, HPDF_INVALID_OBJECT, 0);
        else
            return HPDF_INVALID_OBJECT;
    }

    header = (HPDF_Obj_Header *)obj;

    if (header->obj_id & HPDF_OTYPE_DIRECT ||
            header->obj_id & HPDF_OTYPE_INDIRECT)
        return HPDF_SetError(xref->error, HPDF_INVALID_OBJECT, 0);

    if (xref->entries->count >= HPDF_LIMIT_MAX_XREF_ELEMENT) {
        HPDF_SetError(xref->error, HPDF_XREF_COUNT_ERR, 0);
        goto Fail;
    }

    /* in the following, we have to dispose the object when an error is
     * occurred.
     */

    entry = (HPDF_XrefEntry)HPDF_GetMem (xref->mmgr,
            sizeof(HPDF_XrefEntry_Rec));
    if (entry == NULL)
        goto Fail;

    if (HPDF_List_Add(xref->entries, entry) != HPDF_OK) {
        HPDF_FreeMem (xref->mmgr, entry);
        goto Fail;
    }

    entry->entry_typ = HPDF_IN_USE_ENTRY;
    entry->byte_offset = 0;
    entry->gen_no = 0;
    entry->obj = obj;
    header->obj_id = xref->start_offset + xref->entries->count - 1 +
                    HPDF_OTYPE_INDIRECT;

    header->gen_no = entry->gen_no;

    return HPDF_OK;

Fail:
    HPDF_Obj_ForceFree(xref->mmgr, obj);
    return HPDF_Error_GetCode (xref->error);
}